

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O0

void __thiscall EventDispatcher::handleSyncEvent(EventDispatcher *this,Event *ev)

{
  SyncEventHolder *pSVar1;
  Event *ev_00;
  SyncEventHolder *holder;
  Event *ev_local;
  EventDispatcher *this_local;
  
  pSVar1 = event_cast<EventDispatcher::SyncEventHolder>(ev);
  if (pSVar1 == (SyncEventHolder *)0x0) {
    jh_log_print(1,"void EventDispatcher::handleSyncEvent(Event *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                 ,0x148,"event must not be NULL");
  }
  else {
    ev_00 = SmartPtr::operator_cast_to_Event_((SmartPtr *)&pSVar1->mRealEvent);
    EventDispatcherHelper::dispatchEvent(&this->mDispatcher,ev_00);
    Mutex::Lock(&this->mSyncLock);
    pSVar1->mDone = true;
    Mutex::Unlock(&this->mSyncLock);
    Condition::Broadcast(&this->mSyncWait);
  }
  return;
}

Assistant:

void EventDispatcher::handleSyncEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	SyncEventHolder *holder = event_cast<SyncEventHolder>( ev );

	if ( holder == NULL)
	{
		LOG_ERR_FATAL("event must not be NULL");
		return;
	}	

	mDispatcher.dispatchEvent( holder->mRealEvent );
	mSyncLock.Lock();
	holder->mDone = true;
	mSyncLock.Unlock();
	mSyncWait.Broadcast();
	// ev will get deleted in the caller.
}